

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCopiesAndBlittingTests.cpp
# Opt level: O2

void vkt::api::anon_unknown_0::addResolveImageWholeArrayImageTests(TestCaseGroup *group)

{
  anon_union_4_2_42ec4cd4_for_TestParams_4 aVar1;
  TestContext *testCtx;
  ResolveImageToImageTestCase *this;
  VkSampleCountFlagBits sampleFlag;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  deUint32 layerNdx;
  uint uVar2;
  long lVar3;
  string description;
  string local_f0;
  TestParams params;
  TestParams local_80;
  
  params.regions.
  super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  params.regions.
  super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  params.regions.
  super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  params.src.buffer.size = (Buffer)0x2500000001;
  params.src._8_8_ = 0x4000000040;
  params.src.image.extent.depth = 1;
  params._20_8_ = 0x100000006;
  params.dst.image.format = VK_FORMAT_R8G8B8A8_UNORM;
  params.dst._8_8_ = 0x4000000040;
  params.dst._16_8_ = 0x700000005;
  params.dst.image.extent.depth = 5;
  for (uVar2 = 0; uVar2 < params.dst.image.extent.depth; uVar2 = uVar2 + 1) {
    description._M_dataplus._M_p = (pointer)0x1;
    description._12_8_ = 1;
    description.field_2._4_8_ = 0;
    stack0xfffffffffffffedc = 1;
    description._M_string_length._0_4_ = uVar2;
    std::
    vector<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
    ::push_back(&params.regions,(value_type *)&description);
    in_RDX = extraout_RDX;
  }
  for (lVar3 = 0; lVar3 != 0x18; lVar3 = lVar3 + 4) {
    aVar1 = *(anon_union_4_2_42ec4cd4_for_TestParams_4 *)
             ((long)&api::(anonymous_namespace)::samples + lVar3);
    params.field_3 = aVar1;
    api::(anonymous_namespace)::getSampleCountCaseName_abi_cxx11_
              (&local_f0,(_anonymous_namespace_ *)(ulong)aVar1.filter,(VkSampleCountFlagBits)in_RDX)
    ;
    std::operator+(&description,"With ",&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    this = (ResolveImageToImageTestCase *)operator_new(200);
    testCtx = (group->super_TestNode).m_testCtx;
    api::(anonymous_namespace)::getSampleCountCaseName_abi_cxx11_
              (&local_f0,(_anonymous_namespace_ *)(ulong)aVar1.filter,sampleFlag);
    TestParams::TestParams(&local_80,&params);
    ResolveImageToImageTestCase::ResolveImageToImageTestCase
              (this,testCtx,&local_f0,&description,&local_80,COPY_MS_IMAGE_TO_ARRAY_MS_IMAGE);
    tcu::TestNode::addChild(&group->super_TestNode,(TestNode *)this);
    TestParams::~TestParams(&local_80);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&description);
    in_RDX = extraout_RDX_00;
  }
  TestParams::~TestParams(&params);
  return;
}

Assistant:

void addResolveImageWholeArrayImageTests (tcu::TestCaseGroup* group)
{
	TestParams	params;
	params.src.image.imageType			= VK_IMAGE_TYPE_2D;
	params.src.image.format				= VK_FORMAT_R8G8B8A8_UNORM;
	params.src.image.extent				= defaultExtent;
	params.src.image.operationLayout	= VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL;
	params.dst.image.imageType			= VK_IMAGE_TYPE_2D;
	params.dst.image.format				= VK_FORMAT_R8G8B8A8_UNORM;
	params.dst.image.extent				= defaultExtent;
	params.dst.image.extent.depth		= 5u;
	params.dst.image.operationLayout	= VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL;

	for (deUint32 layerNdx=0; layerNdx < params.dst.image.extent.depth; ++layerNdx)
	{
		const VkImageSubresourceLayers	sourceLayer	=
		{
			VK_IMAGE_ASPECT_COLOR_BIT,		// VkImageAspectFlags	aspectMask;
			0u,								// uint32_t				mipLevel;
			layerNdx,						// uint32_t				baseArrayLayer;
			1u								// uint32_t				layerCount;
		};

		const VkImageResolve			testResolve	=
		{
			sourceLayer,		// VkImageSubresourceLayers	srcSubresource;
			{0, 0, 0},			// VkOffset3D				srcOffset;
			sourceLayer,		// VkImageSubresourceLayers	dstSubresource;
			{0, 0, 0},			// VkOffset3D				dstOffset;
			defaultExtent,		// VkExtent3D				extent;
		};

		CopyRegion	imageResolve;
		imageResolve.imageResolve	= testResolve;
		params.regions.push_back(imageResolve);
	}

	for (int samplesIndex = 0; samplesIndex < DE_LENGTH_OF_ARRAY(samples); ++samplesIndex)
	{
		params.samples					= samples[samplesIndex];
		const std::string description	= "With " + getSampleCountCaseName(samples[samplesIndex]);
		group->addChild(new ResolveImageToImageTestCase(group->getTestContext(), getSampleCountCaseName(samples[samplesIndex]), description, params, COPY_MS_IMAGE_TO_ARRAY_MS_IMAGE));
	}
}